

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

s32 __thiscall
irr::core::array<irr::video::CNullDriver::SSurface>::binary_search_multi
          (array<irr::video::CNullDriver::SSurface> *this,SSurface *element,s32 *last)

{
  pointer pSVar1;
  s32 sVar2;
  pair<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>,___gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface_*,_std::vector<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>_>_>
  pVar3;
  
  sort(this);
  pVar3 = ::std::
          __equal_range<__gnu_cxx::__normal_iterator<irr::video::CNullDriver::SSurface*,std::vector<irr::video::CNullDriver::SSurface,std::allocator<irr::video::CNullDriver::SSurface>>>,irr::video::CNullDriver::SSurface,__gnu_cxx::__ops::_Iter_less_val,__gnu_cxx::__ops::_Val_less_iter>
                    ((this->m_data).
                     super__Vector_base<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_data).
                     super__Vector_base<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
                     ._M_impl.super__Vector_impl_data._M_finish,element);
  if (pVar3.first._M_current._M_current == pVar3.second._M_current._M_current) {
    sVar2 = -1;
  }
  else {
    pSVar1 = (this->m_data).
             super__Vector_base<irr::video::CNullDriver::SSurface,_std::allocator<irr::video::CNullDriver::SSurface>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *last = (int)((ulong)((long)pVar3.second._M_current._M_current - (long)pSVar1) >> 3) + -1;
    sVar2 = (s32)((ulong)((long)pVar3.first._M_current._M_current - (long)pSVar1) >> 3);
  }
  return sVar2;
}

Assistant:

s32 binary_search_multi(const T &element, s32 &last)
	{
		sort();
		auto iters = std::equal_range(m_data.begin(), m_data.end(), element);
		if (iters.first == iters.second)
			return -1;
		last = static_cast<s32>((iters.second - m_data.begin()) - 1);
		return static_cast<s32>(iters.first - m_data.begin());
	}